

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

void __thiscall SQGenerator::Finalize(SQGenerator *this)

{
  SQObjectPtr local_18;
  
  local_18.super_SQObject._type = OT_NULL;
  local_18.super_SQObject._unVal.pTable = (SQTable *)0x0;
  sqvector<SQObjectPtr>::resize(&this->_stack,0,&local_18);
  SQObjectPtr::~SQObjectPtr(&local_18);
  SQObjectPtr::Null(&this->_closure);
  return;
}

Assistant:

void Finalize(){_stack.resize(0);_closure.Null();}